

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

BCIns * lj_snap_restore(jit_State *J,void *exptr)

{
  TValue *o;
  TValue *pTVar1;
  ushort uVar2;
  uint uVar3;
  CTypeID id;
  jit_State *J_00;
  SnapShot *pSVar4;
  SnapEntry *pSVar5;
  lua_State *L;
  IRIns *pIVar6;
  IRIns *pIVar7;
  IRIns *pIVar8;
  long lVar9;
  CTInfo info;
  uint uVar10;
  undefined4 uVar11;
  BloomFilter rfilt;
  ulong uVar12;
  GCcdata *pGVar13;
  GCtab *t;
  byte bVar14;
  byte *pbVar15;
  uint uVar16;
  ulong uVar17;
  IRIns *pIVar18;
  uint ref;
  IRIns *pIVar19;
  ExitState *ex;
  IRRef2 IVar20;
  ulong uVar21;
  TValue *in_stack_ffffffffffffff48;
  CTSize in_stack_ffffffffffffff50;
  TValue *local_a0;
  CTSize sz;
  long local_68;
  IRIns *local_60;
  ulong local_58;
  TValue local_50;
  long local_48;
  lua_State *local_40;
  BCIns *local_38;
  
  uVar3 = J->exitno;
  ex = (ExitState *)(ulong)uVar3;
  J_00 = (jit_State *)J->trace[J->parent].gcptr64;
  pSVar4 = (J_00->cur).snap;
  uVar21 = (ulong)pSVar4[(long)ex].nent;
  uVar16 = pSVar4[(long)ex].mapofs;
  pSVar5 = (J_00->cur).snapmap;
  rfilt = snap_renamefilter((GCtrace *)J_00,uVar3);
  local_38 = (BCIns *)(*(ulong *)(pSVar5 + uVar16 + uVar21) >> 8);
  L = J->L;
  *(BCIns **)(((ulong)L->cframe & 0xfffffffffffffffc) + 0x18) = local_38 + 1;
  local_a0 = L->base;
  bVar14 = pSVar4[(long)ex].topslot;
  local_68 = (long)ex * 0xc;
  local_58 = uVar21;
  local_40 = L;
  if ((TValue *)(L->maxstack).ptr64 <= local_a0 + bVar14) {
    L->top = local_a0 + *(byte *)(*(long *)((local_a0[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
    lj_state_growstack(L,(uint)bVar14 -
                         (uint)*(byte *)(*(long *)((local_a0[-2].u64 & 0x7fffffffffff) + 0x20) +
                                        -0x5d));
    local_a0 = L->base;
  }
  local_48 = (long)&pSVar4->mapofs + local_68;
  pTVar1 = local_a0 + -2;
  uVar21 = 0;
  do {
    if (uVar21 == local_58) {
      local_a0 = local_40->base + (byte)pSVar5[uVar16 + local_58];
      local_40->base = local_a0;
      uVar16 = (byte)*local_38 - 0x3f;
      uVar3 = uVar16 >> 1;
      if ((((uVar3 | (uint)((uVar16 & 1) != 0) << 0x1f) < 6) && ((0x27U >> (uVar3 & 0x1f) & 1) != 0)
          ) || (0x58 < (byte)*local_38)) {
        pbVar15 = (byte *)(local_48 + 8);
        local_a0 = pTVar1;
      }
      else {
        pbVar15 = (byte *)(*(long *)((local_a0[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
      }
      local_40->top = local_a0 + *pbVar15;
      return local_38;
    }
    uVar10 = pSVar5[uVar16 + uVar21];
    if ((uVar10 >> 0x12 & 1) == 0) {
      o = pTVar1 + (uVar10 >> 0x18);
      ref = uVar10 & 0xffff;
      uVar17 = (ulong)ref;
      pIVar19 = (J_00->cur).ir;
      if (*(char *)((long)pIVar19 + uVar17 * 8 + 6) == -3) {
        pIVar18 = pIVar19 + uVar17;
        uVar12 = 0;
        do {
          if (uVar21 == uVar12) {
            if ((pIVar18->field_1).o - 0x53 < 2) {
              local_60 = *(IRIns **)(*(long *)((long)J->L + 0x10) + 0x180);
              local_60[2] = (IRIns)J->L;
              id = pIVar19[(pIVar18->field_0).op1].field_1.op12;
              info = lj_ctype_info((CTState *)&local_60->field_0,id,&sz);
              pGVar13 = lj_cdata_newx((CTState *)&local_60->field_0,id,sz,info);
              o->u64 = (ulong)pGVar13 | 0xfffa800000000000;
              if ((pIVar18->field_1).o == 'T') {
                in_stack_ffffffffffffff48 =
                     (TValue *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),sz);
                snap_restoredata(J_00,(GCtrace *)exptr,ex,(SnapNo)rfilt,
                                 (ulong)(pIVar18->field_0).op2,(int)pGVar13 + 0x10,
                                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
              }
              else {
                uVar2 = *(ushort *)((long)&((J_00->cur).snap)->ref + local_68);
                pIVar6 = (J_00->cur).ir;
                pIVar19 = pIVar19 + uVar17;
                while (pIVar8 = pIVar19, pIVar19 = pIVar8 + 1, pIVar19 < pIVar6 + uVar2) {
                  if (*(char *)((long)pIVar8 + 0xe) == -2) {
                    if ((ulong)*(byte *)((long)pIVar8 + 0xf) == 0xff) {
                      uVar10 = snap_sunk_store2((GCtrace *)J_00,pIVar18,pIVar19);
                    }
                    else {
                      uVar10 = (uint)(pIVar19 == pIVar18 + *(byte *)((long)pIVar8 + 0xf));
                    }
                    if (uVar10 != 0) {
                      uVar11 = 8;
                      if ((0x605fd9U >> (*(uint *)((long)pIVar8 + 0xc) & 0x1f) & 1) == 0) {
                        bVar14 = ((byte)*(uint *)((long)pIVar8 + 0xc) & 0x1f) - 0xf;
                        uVar11 = 4;
                        if (bVar14 < 4) {
                          uVar11 = *(undefined4 *)(&DAT_0015d084 + (ulong)bVar14 * 4);
                        }
                      }
                      pIVar7 = (J_00->cur).ir;
                      uVar17 = (ulong)*(ushort *)
                                       ((long)pIVar7 + (ulong)(pIVar19->field_0).op1 * 8 + 2);
                      if (*(char *)((long)pIVar7 + uVar17 * 8 + 5) == '\x1d') {
                        IVar20 = pIVar7[uVar17 + 1].i;
                      }
                      else {
                        IVar20 = pIVar7[uVar17].field_1.op12;
                      }
                      in_stack_ffffffffffffff48 =
                           (TValue *)
                           CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),uVar11);
                      snap_restoredata(J_00,(GCtrace *)exptr,ex,(SnapNo)rfilt,
                                       (ulong)*(ushort *)((long)pIVar8 + 10),IVar20 + (int)pGVar13,
                                       in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
                    }
                  }
                }
              }
            }
            else {
              if ((pIVar18->field_1).o == 0x51) {
                t = lj_tab_new(J->L,(uint)(pIVar18->field_0).op1,(uint)(pIVar18->field_0).op2);
              }
              else {
                t = lj_tab_dup(J->L,(GCtab *)pIVar19[(ulong)(pIVar18->field_0).op1 + 1]);
              }
              o->u64 = (ulong)t | 0xfffa000000000000;
              uVar2 = *(ushort *)((long)&((J_00->cur).snap)->ref + local_68);
              pIVar6 = (J_00->cur).ir;
              pIVar19 = pIVar19 + uVar17;
              local_60 = pIVar18;
              while (pIVar8 = pIVar19, pIVar19 = pIVar8 + 1, pIVar19 < pIVar6 + uVar2) {
                if (*(char *)((long)pIVar8 + 0xe) == -2) {
                  if ((ulong)*(byte *)((long)pIVar8 + 0xf) == 0xff) {
                    uVar10 = snap_sunk_store2((GCtrace *)J_00,pIVar18,pIVar19);
                  }
                  else {
                    uVar10 = (uint)(pIVar19 == pIVar18 + *(byte *)((long)pIVar8 + 0xf));
                  }
                  if (uVar10 != 0) {
                    pIVar7 = (J_00->cur).ir;
                    if (*(char *)((long)pIVar7 + (ulong)(pIVar19->field_0).op1 * 8 + 5) == '>') {
                      in_stack_ffffffffffffff48 = &local_50;
                      snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar3,rfilt,
                                      (uint)*(ushort *)((long)pIVar8 + 10),in_stack_ffffffffffffff48
                                     );
                      (t->metatable).gcptr64 = local_50.u64 & 0x7fffffffffff;
                    }
                    else {
                      pIVar18 = pIVar7 + *(ushort *)
                                          ((long)pIVar7 + (ulong)(pIVar19->field_0).op1 * 8 + 2);
                      if ((pIVar18->field_1).o == '\x1e') {
                        pIVar18 = pIVar7 + (pIVar18->field_0).op1;
                      }
                      lj_ir_kvalue(J->L,&local_50,pIVar18);
                      in_stack_ffffffffffffff48 = lj_tab_set(J->L,t,&local_50);
                      snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar3,rfilt,
                                      (uint)*(ushort *)((long)pIVar8 + 10),in_stack_ffffffffffffff48
                                     );
                      pIVar18 = local_60;
                    }
                  }
                }
              }
            }
            goto LAB_0012a982;
          }
          lVar9 = uVar16 + uVar12;
          uVar12 = uVar12 + 1;
        } while ((pSVar5[lVar9] & 0xffff) != ref);
        *o = pTVar1[pSVar5[lVar9] >> 0x18];
      }
      else {
        in_stack_ffffffffffffff48 = o;
        snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar3,rfilt,ref,o);
        if ((uVar10 >> 0x14 & 1) != 0) {
          (o->field_4).i = (int)o->n;
          (o->field_4).it = 0xfffe7fff;
        }
      }
    }
LAB_0012a982:
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

const BCIns *lj_snap_restore(jit_State *J, void *exptr)
{
  ExitState *ex = (ExitState *)exptr;
  SnapNo snapno = J->exitno;  /* For now, snapno == exitno. */
  GCtrace *T = traceref(J, J->parent);
  SnapShot *snap = &T->snap[snapno];
  MSize n, nent = snap->nent;
  SnapEntry *map = &T->snapmap[snap->mapofs];
#if !LJ_FR2 || defined(LUA_USE_ASSERT)
  SnapEntry *flinks = &T->snapmap[snap_nextofs(T, snap)-1-LJ_FR2];
#endif
#if !LJ_FR2
  ptrdiff_t ftsz0;
#endif
  TValue *frame;
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  const BCIns *pc = snap_pc(&map[nent]);
  lua_State *L = J->L;

  /* Set interpreter PC to the next PC to get correct error messages. */
  setcframe_pc(cframe_raw(L->cframe), pc+1);

  /* Make sure the stack is big enough for the slots from the snapshot. */
  if (LJ_UNLIKELY(L->base + snap->topslot >= tvref(L->maxstack))) {
    L->top = curr_topL(L);
    lj_state_growstack(L, snap->topslot - curr_proto(L)->framesize);
  }

  /* Fill stack slots with data from the registers and spill slots. */
  frame = L->base-1-LJ_FR2;
#if !LJ_FR2
  ftsz0 = frame_ftsz(frame);  /* Preserve link to previous frame in slot #0. */
#endif
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    if (!(sn & SNAP_NORESTORE)) {
      TValue *o = &frame[snap_slot(sn)];
      IRRef ref = snap_ref(sn);
      IRIns *ir = &T->ir[ref];
      if (ir->r == RID_SUNK) {
	MSize j;
	for (j = 0; j < n; j++)
	  if (snap_ref(map[j]) == ref) {  /* De-duplicate sunk allocations. */
	    copyTV(L, o, &frame[snap_slot(map[j])]);
	    goto dupslot;
	  }
	snap_unsink(J, T, ex, snapno, rfilt, ir, o);
      dupslot:
	continue;
      }
      snap_restoreval(J, T, ex, snapno, rfilt, ref, o);
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM) && tvisint(o)) {
	TValue tmp;
	snap_restoreval(J, T, ex, snapno, rfilt, ref+1, &tmp);
	o->u32.hi = tmp.u32.lo;
#if !LJ_FR2
      } else if ((sn & (SNAP_CONT|SNAP_FRAME))) {
	/* Overwrite tag with frame link. */
	setframe_ftsz(o, snap_slot(sn) != 0 ? (int32_t)*flinks-- : ftsz0);
	L->base = o+1;
#endif
      } else if ((sn & SNAP_KEYINDEX)) {
	/* A IRT_INT key index slot is restored as a number. Undo this. */
	o->u32.lo = (uint32_t)(LJ_DUALNUM ? intV(o) : lj_num2int(numV(o)));
	o->u32.hi = LJ_KEYINDEX;
      }
    }
  }
#if LJ_FR2
  L->base += (map[nent+LJ_BE] & 0xff);
#endif
  lj_assertJ(map + nent == flinks, "inconsistent frames in snapshot");

  /* Compute current stack top. */
  switch (bc_op(*pc)) {
  default:
    if (bc_op(*pc) < BC_FUNCF) {
      L->top = curr_topL(L);
      break;
    }
    /* fallthrough */
  case BC_CALLM: case BC_CALLMT: case BC_RETM: case BC_TSETM:
    L->top = frame + snap->nslots;
    break;
  }
  return pc;
}